

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool tryParseFile(string *fname,vector<Tle,_std::allocator<Tle>_> *tles)

{
  long lVar1;
  char *__filename;
  iterator iVar2;
  move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
  __last;
  __normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_> local_50;
  const_iterator local_48;
  undefined1 local_40 [8];
  vector<Tle,_std::allocator<Tle>_> newTLEs;
  FILE *fp;
  vector<Tle,_std::allocator<Tle>_> *tles_local;
  string *fname_local;
  
  lVar1 = std::__cxx11::string::find((char *)fname,0x127734);
  if (lVar1 == -1) {
    __filename = (char *)std::__cxx11::string::c_str();
    newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)fopen(__filename,"r");
    if ((FILE *)newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (FILE *)0x0) {
      fname_local._7_1_ = false;
    }
    else {
      readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_40,fname,
               (FILE *)newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      local_50._M_current = (Tle *)std::vector<Tle,_std::allocator<Tle>_>::end(tles);
      __gnu_cxx::__normal_iterator<Tle_const*,std::vector<Tle,std::allocator<Tle>>>::
      __normal_iterator<Tle*>
                ((__normal_iterator<Tle_const*,std::vector<Tle,std::allocator<Tle>>> *)&local_48,
                 &local_50);
      iVar2 = std::vector<Tle,_std::allocator<Tle>_>::begin
                        ((vector<Tle,_std::allocator<Tle>_> *)local_40);
      __first = std::
                make_move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>
                          ((__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>)
                           iVar2._M_current);
      iVar2 = std::vector<Tle,_std::allocator<Tle>_>::end
                        ((vector<Tle,_std::allocator<Tle>_> *)local_40);
      __last = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>
                         ((__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>)
                          iVar2._M_current);
      std::vector<Tle,std::allocator<Tle>>::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>,void>
                ((vector<Tle,std::allocator<Tle>> *)tles,local_48,__first,__last);
      fclose((FILE *)newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      fname_local._7_1_ = true;
      std::vector<Tle,_std::allocator<Tle>_>::~vector((vector<Tle,_std::allocator<Tle>_> *)local_40)
      ;
    }
  }
  else {
    fname_local._7_1_ = false;
  }
  return fname_local._7_1_;
}

Assistant:

static bool tryParseFile(const std::string &fname, std::vector<Tle> &tles) {
  // If it looks like a URL, don't try to open it.
  if (fname.find("://") != std::string::npos)
    return false;

  FILE *fp; // We use c-style file i/o so we can use tmpfile in tryParseURL.
  if (!(fp = fopen(fname.c_str(), "r")))
    return false;

  // Read the new TLEs and add them to 'tles'.
  auto newTLEs = readTLEs(fname, fp);
  tles.insert(tles.end(), std::make_move_iterator(newTLEs.begin()),
              std::make_move_iterator(newTLEs.end()));
  fclose(fp);
  return true;
}